

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

bool __thiscall State::moveDown(State *this,State *s)

{
  int iVar1;
  State *this_00;
  int iVar2;
  
  iVar1 = (this->blank).height;
  iVar2 = this->height + -1;
  if (iVar1 != iVar2) {
    operator=(s,this);
    moveBlank(s,(Coords)0x1);
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return iVar1 != iVar2;
}

Assistant:

bool State::moveDown(State &s) {
    if (blank.height == height - 1) {
        return false;
    }

    s = *this;
    s.moveX(+1);
    s.previous = new State(*this);
    return true;
}